

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnLocusP.cpp
# Opt level: O2

LLPoint GeoCalcs::PointOnLocusP(Locus *loc,LLPoint *geoPt,double tol,double eps)

{
  double dVar1;
  LLPoint LVar2;
  InverseResult result;
  InverseResult local_38;
  
  dVar1 = DistToLocusP(loc,geoPt,tol,eps);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_38.azimuth = 0.0;
    local_38.reverseAzimuth = 0.0;
    local_38.distance = 0.0;
    DistVincenty(geoPt,&loc->geoStart,&local_38);
    local_38.azimuth = *(double *)(&DAT_00159220 + (ulong)(0.0 < dVar1) * 8) + local_38.azimuth;
    LVar2 = DestVincenty(geoPt,local_38.azimuth,ABS(dVar1));
  }
  else {
    LVar2 = *geoPt;
  }
  return LVar2;
}

Assistant:

LLPoint PointOnLocusP(const Locus &loc, const LLPoint &geoPt, double tol, double eps)
    {
        const double distp = DistToLocusP(loc, geoPt, tol, eps);

        if (distp == 0)
            return geoPt;

        InverseResult result;
        DistVincenty(geoPt, loc.geoStart, result);

        result.azimuth += distp > 0.0 ? -M_PI / 2.0 : M_PI / 2.0;

        return DestVincenty(geoPt, result.azimuth, fabs(distp));
    }